

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O2

void __thiscall
TRM::SWRaster::sweep_hline(SWRaster *this,int32_t x,int32_t y,int32_t area,int32_t count)

{
  pointer pSVar1;
  uint uVar2;
  uint uVar3;
  Span span;
  Span local_10;
  
  uVar3 = area >> 9;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (this->even_odd == true) {
    uVar2 = uVar2 & 0x1ff;
    if (0x100 < uVar2) {
      local_10.cover = 0x200 - uVar2;
      goto LAB_00111465;
    }
    local_10.cover = 0xff;
    if (uVar2 == 0x100) goto LAB_00111465;
  }
  else if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  local_10.cover = uVar2;
  if (uVar2 == 0) {
    return;
  }
LAB_00111465:
  pSVar1 = (this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((((this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
         super__Vector_impl_data._M_start != pSVar1) && (pSVar1[-1].y == y)) &&
      (pSVar1[-1].x + pSVar1[-1].len == x)) && (pSVar1[-1].cover == local_10.cover)) {
    pSVar1[-1].len = pSVar1[-1].len + count;
    return;
  }
  local_10.x = x;
  local_10.y = y;
  local_10.len = count;
  std::vector<TRM::Span,std::allocator<TRM::Span>>::emplace_back<TRM::Span&>
            ((vector<TRM::Span,std::allocator<TRM::Span>> *)&this->m_spans,&local_10);
  return;
}

Assistant:

void SWRaster::sweep_hline(int32_t x, int32_t y, int32_t area, int32_t count) {
  /* compute the coverage line's coverage, depending on the    */
  /* outline fill rule                                         */
  /*                                                           */
  /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
  /*                                                           */
  int32_t coverage = static_cast<int32_t>(area >> (PIXEL_BITS * 2 + 1 - 8));
  // use range [0, 256]
  if (coverage < 0) {
    coverage = -coverage;
  }

  if (this->even_odd) {
    coverage &= 511;
    if (coverage > 256)
      coverage = 512 - coverage;
    else if (coverage == 256)
      coverage = 255;
  } else {
    if (coverage >= 256) coverage = 255;
  }

  x = std::min(x, std::numeric_limits<int32_t>::max());
  y = std::min(y, std::numeric_limits<int32_t>::max());

  if (coverage) {
    if (!m_spans.empty()) {
      auto p_span = &m_spans.back();
      if (p_span->y == y && p_span->x + p_span->len == x &&
          p_span->cover == coverage) {
        p_span->len = p_span->len + count;
        return;
      }
    }

    Span span;
    span.x = x;
    span.y = y;
    span.len = count;
    span.cover = coverage;

    m_spans.emplace_back(span);
  }
}